

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalInterfaceTiledExamples.cpp
# Opt level: O0

void readTiled1(char *fileName,Array2D<GZ> *pixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  GZ *pGVar3;
  _Base_ptr in_RCX;
  _Base_ptr in_RDX;
  _Base_ptr in_RSI;
  char *in_RDI;
  FrameBuffer frameBuffer;
  int dy;
  int dx;
  Box2i dw;
  TiledInputFile in;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  long in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  Slice local_f8 [56];
  Slice local_c0 [56];
  char local_88 [52];
  int local_54;
  int local_50;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  FrameBuffer local_30;
  
  local_30._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = in_RCX;
  local_30._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = in_RDX;
  local_30._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = in_RSI;
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)&local_30,in_RDI,iVar1);
  Imf_3_2::TiledInputFile::header();
  Imf_3_2::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  (local_30._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->_M_color =
       (local_38 - local_40) + _S_black;
  (local_30._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_color =
       (local_34 - local_3c) + _S_black;
  local_50 = local_40;
  local_54 = local_3c;
  Imf_3_2::Array2D<GZ>::resizeErase
            ((Array2D<GZ> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),in_stack_fffffffffffffec0
            );
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x10a49c);
  pGVar3 = Imf_3_2::Array2D<GZ>::operator[]
                     ((Array2D<GZ> *)
                      local_30._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                      (long)-local_54);
  Imf_3_2::Slice::Slice
            (local_c0,HALF,(char *)(pGVar3 + -local_50),8,
             (long)(int)(local_30._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                        _M_color << 3,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert(local_88,(Slice *)"G");
  pGVar3 = Imf_3_2::Array2D<GZ>::operator[]
                     ((Array2D<GZ> *)
                      local_30._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                      (long)-local_54);
  Imf_3_2::Slice::Slice
            (local_f8,FLOAT,(char *)&pGVar3[-local_50].z,8,
             (long)(int)(local_30._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                        _M_color << 3,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert(local_88,(Slice *)"Z");
  Imf_3_2::TiledInputFile::setFrameBuffer(&local_30);
  iVar1 = Imf_3_2::TiledInputFile::numXTiles((int)&local_30);
  iVar1 = iVar1 + -1;
  iVar2 = Imf_3_2::TiledInputFile::numYTiles((int)&local_30);
  Imf_3_2::TiledInputFile::readTiles((int)&local_30,0,iVar1,0,iVar2 + -1);
  Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x10a647);
  Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&local_30);
  return;
}

Assistant:

void
readTiled1 (const char fileName[], Array2D<GZ>& pixels, int& width, int& height)
{
    TiledInputFile in (fileName);

    Box2i dw = in.header ().dataWindow ();
    width    = dw.max.x - dw.min.x + 1;
    height   = dw.max.y - dw.min.y + 1;
    int dx   = dw.min.x;
    int dy   = dw.min.y;

    pixels.resizeErase (height, width);

    FrameBuffer frameBuffer;

    frameBuffer.insert (
        "G", // name
        Slice (
            IMF::HALF,                       // type
            (char*) &pixels[-dy][-dx].g,     // base
            sizeof (pixels[0][0]) * 1,       // xStride
            sizeof (pixels[0][0]) * width)); // yStride

    frameBuffer.insert (
        "Z", // name
        Slice (
            IMF::FLOAT,                      // type
            (char*) &pixels[-dy][-dx].z,     // base
            sizeof (pixels[0][0]) * 1,       // xStride
            sizeof (pixels[0][0]) * width)); // yStride

    in.setFrameBuffer (frameBuffer);
    in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);
}